

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcUtils.c
# Opt level: O2

int Mvc_CoverCountCubePairDiffs(Mvc_Cover_t *pCover,uchar *pDiffs)

{
  uint uVar1;
  Mvc_Cube_t *pCube;
  Mvc_Cube_t *pMVar2;
  Mvc_CubeWord_t *pMVar3;
  long lVar4;
  Mvc_Cube_t *pMVar5;
  int _i_;
  uint uVar6;
  int iVar7;
  Mvc_CubeWord_t *pMVar8;
  
  pCube = Mvc_CubeAlloc(pCover);
  uVar1 = pCover->nBits;
  pMVar2 = (Mvc_Cube_t *)&pCover->lCubes;
  pMVar3 = pCube->pData;
  lVar4 = 0;
  while (pMVar2 = pMVar2->pNext, pMVar2 != (Mvc_Cube_t *)0x0) {
    lVar4 = (long)(int)lVar4;
    pMVar5 = pMVar2;
    while (pMVar5 = pMVar5->pNext, pMVar5 != (Mvc_Cube_t *)0x0) {
      uVar6 = *(uint *)&pMVar2->field_0x8 & 0xffffff;
      if (uVar6 == 0) {
        *pMVar3 = pMVar5->pData[0] ^ pMVar2->pData[0];
      }
      else if (uVar6 == 1) {
        pCube->pData[0] = pMVar5->pData[0] ^ pMVar2->pData[0];
        *(uint *)&pCube->field_0x14 = *(uint *)&pMVar5->field_0x14 ^ *(uint *)&pMVar2->field_0x14;
      }
      else {
        for (; -1 < (int)uVar6; uVar6 = uVar6 - 1) {
          pMVar3[uVar6] = pMVar5->pData[uVar6] ^ pMVar2->pData[uVar6];
        }
      }
      iVar7 = 0;
      for (pMVar8 = pMVar3;
          pMVar8 < (byte *)((long)pCube->pData +
                           (long)(int)(((int)((ulong)(long)(int)uVar1 >> 3) + 1) -
                                      (uint)((uVar1 & 7) == 0)));
          pMVar8 = (Mvc_CubeWord_t *)((long)pMVar8 + 1)) {
        iVar7 = iVar7 + bit_count[(byte)*pMVar8];
      }
      pDiffs[lVar4] = (uchar)iVar7;
      lVar4 = lVar4 + 1;
    }
  }
  Mvc_CubeFree(pCover,pCube);
  return 1;
}

Assistant:

int Mvc_CoverCountCubePairDiffs( Mvc_Cover_t * pCover, unsigned char pDiffs[] )
{
    Mvc_Cube_t * pCube1;
    Mvc_Cube_t * pCube2;
    Mvc_Cube_t * pMask;
    unsigned char * pByte, * pByteStart, * pByteStop;
    int nBytes, nOnes;
    int nCubePairs;

    // allocate a temporary mask
    pMask = Mvc_CubeAlloc( pCover );
    // get the number of unsigned chars in the cube's bit strings
    nBytes = pCover->nBits / (8 * sizeof(unsigned char)) + (int)(pCover->nBits % (8 * sizeof(unsigned char)) > 0);
    // iterate through the cubes
    nCubePairs = 0;
    Mvc_CoverForEachCube( pCover, pCube1 )
    {
        Mvc_CoverForEachCubeStart( Mvc_CubeReadNext(pCube1), pCube2 )
        {
            // find the bit-wise exor of cubes
            Mvc_CubeBitExor( pMask, pCube1, pCube2 );
            // set the starting and stopping positions
            pByteStart = (unsigned char *)pMask->pData;
            pByteStop  = pByteStart + nBytes;
            // clean the counter of ones
            nOnes = 0;
            // iterate through the positions
            for ( pByte = pByteStart; pByte < pByteStop; pByte++ )
                nOnes += bit_count[*pByte];
            // set the nOnes
            pDiffs[nCubePairs++] = nOnes;
        }
    }
    // deallocate the mask
    Mvc_CubeFree( pCover, pMask );
    return 1;
}